

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cpp
# Opt level: O2

Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_> *
wasm::WATParser::anon_unknown_21::wastModule
          (Result<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>_>
           *__return_storage_ptr__,Lexer *in,bool maybeInvalid)

{
  undefined1 auVar1 [16];
  undefined8 uVar2;
  element_type *peVar3;
  bool bVar4;
  int iVar5;
  string *psVar6;
  undefined4 uVar7;
  int iVar8;
  string_view expected;
  string_view expected_00;
  string_view expected_01;
  undefined1 local_2c8 [8];
  optional<wasm::Name> id;
  stringstream ss;
  ostream local_2a0 [16];
  char local_290;
  undefined1 local_128 [8];
  Lexer reset;
  string local_b0;
  string local_90;
  undefined1 local_70 [8];
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> s;
  shared_ptr<wasm::Module> wasm;
  
  Lexer::Lexer((Lexer *)local_128,in);
  expected._M_str = "module";
  expected._M_len = 6;
  bVar4 = Lexer::takeSExprStart(in,expected);
  if (bVar4) {
    Lexer::takeID((optional<wasm::Name> *)local_2c8,in);
    expected_00._M_str = "quote";
    expected_00._M_len = 5;
    bVar4 = Lexer::takeKeyword(in,expected_00);
    uVar7 = 0;
    if (!bVar4) {
      expected_01._M_str = "binary";
      expected_01._M_len = 6;
      bVar4 = Lexer::takeKeyword(in,expected_01);
      if (!bVar4) {
        if (!maybeInvalid) {
          Lexer::operator=(in,(Lexer *)local_128);
          std::make_shared<wasm::Module>();
          parseModule((Result<wasm::Ok> *)
                      &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_engaged,
                      (Module *)
                      s.
                      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                      ._M_payload.
                      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                      .
                      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ._32_8_,in);
          if (local_290 == '\x01') {
            std::__cxx11::string::string
                      ((string *)local_70,
                       (string *)
                       &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                        super__Optional_payload_base<wasm::Name>._M_engaged);
            std::__detail::__variant::
            _Variant_storage<false,std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>,wasm::Err>
            ::_Variant_storage<1ul,wasm::Err>
                      ((_Variant_storage<false,std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>,wasm::Err>
                        *)__return_storage_ptr__,local_70);
            std::__cxx11::string::~string((string *)local_70);
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                              &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::Name>._M_engaged);
          }
          else {
            std::__detail::__variant::_Variant_storage<false,_wasm::Ok,_wasm::Err>::
            ~_Variant_storage((_Variant_storage<false,_wasm::Ok,_wasm::Err> *)
                              &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                               super__Optional_payload_base<wasm::Name>._M_engaged);
            uVar2 = s.
                    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                    ._M_payload.
                    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                    .
                    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    ._32_8_;
            peVar3 = wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            stack0xffffffffffffffb8 = (string_view)ZEXT816(0);
            *(undefined8 *)
             &(__return_storage_ptr__->val).
              super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
              .
              super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
              .
              super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
              .
              super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
              .
              super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
              .
              super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                 = uVar2;
            *(element_type **)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
             + 8) = peVar3;
            *(undefined1 *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
             + 0x28) = 1;
            *(__index_type *)
             ((long)&(__return_storage_ptr__->val).
                     super__Variant_base<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                     .
                     super__Move_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                     .
                     super__Copy_assign_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                     .
                     super__Move_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                     .
                     super__Copy_ctor_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
                     .
                     super__Variant_storage_alias<std::variant<wasm::WATParser::QuotedModule,_std::shared_ptr<wasm::Module>_>,_wasm::Err>
             + 0x30) = '\0';
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&wasm);
          goto LAB_00c8567a;
        }
        for (iVar8 = 1; iVar8 != 0; iVar8 = iVar8 + iVar5) {
          bVar4 = Lexer::takeUntilParen(in);
          if (!bVar4) break;
          bVar4 = Lexer::takeLParen(in);
          iVar5 = 1;
          if (!bVar4) {
            bVar4 = Lexer::takeRParen(in);
            iVar5 = -1;
            if (!bVar4) {
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_b0,"unexpected end of script",(allocator<char> *)local_70)
              ;
              Lexer::err((Err *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                                 super__Optional_payload_base<wasm::Name>._M_engaged,in,&local_b0);
              std::__detail::__variant::
              _Variant_storage<false,std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>,wasm::Err>
              ::_Variant_storage<1ul,wasm::Err>
                        ((_Variant_storage<false,std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>,wasm::Err>
                          *)__return_storage_ptr__,
                         &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                          super__Optional_payload_base<wasm::Name>._M_engaged);
              std::__cxx11::string::~string
                        ((string *)
                         &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                          super__Optional_payload_base<wasm::Name>._M_engaged);
              psVar6 = &local_b0;
              goto LAB_00c855dc;
            }
          }
        }
        join_0x00000010_0x00000000_ = Lexer::next((Lexer *)local_128);
        join_0x00000010_0x00000000_ =
             std::basic_string_view<char,_std::char_traits<char>_>::substr
                       ((basic_string_view<char,_std::char_traits<char>_> *)
                        &s.
                         super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                         ._M_payload.
                         super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                         .
                         super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         ._M_engaged,0,in->pos - (long)local_128);
        std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
                  ((string *)local_70,
                   (basic_string_view<char,_std::char_traits<char>_> *)
                   &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged,
                   (allocator<char> *)
                   ((long)&wasm.super___shared_ptr<wasm::Module,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount._M_pi + 7));
        auVar1._12_4_ = 0;
        auVar1._0_12_ = stack0xfffffffffffffd54;
        stack0xfffffffffffffd50 = (basic_string_view<char,_std::char_traits<char>_>)(auVar1 << 0x20)
        ;
        std::__cxx11::string::string((string *)&ss,(string *)local_70);
        std::__detail::__variant::
        _Variant_storage<false,std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>,wasm::Err>
        ::_Variant_storage<0ul,wasm::WATParser::QuotedModule>
                  ((_Variant_storage<false,std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>,wasm::Err>
                    *)__return_storage_ptr__,
                   &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                    super__Optional_payload_base<wasm::Name>._M_engaged);
        std::__cxx11::string::~string((string *)&ss);
        psVar6 = (string *)local_70;
        goto LAB_00c855dc;
      }
      uVar7 = 1;
    }
    std::__cxx11::stringstream::stringstream
              ((stringstream *)
               &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    while( true ) {
      Lexer::takeString_abi_cxx11_
                ((optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_70,in);
      if (s.
          super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
          ._M_payload.
          super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
          .
          super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ._M_payload._24_1_ == '\0') break;
      std::operator<<(local_2a0,(string *)local_70);
      std::
      _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_70);
    }
    std::
    _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::_M_reset((_Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_70);
    bVar4 = Lexer::takeRParen(in);
    if (bVar4) {
      psVar6 = (string *)&s;
      local_70._0_4_ = uVar7;
      std::__cxx11::stringbuf::str();
      std::__detail::__variant::
      _Variant_storage<false,std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>,wasm::Err>
      ::_Variant_storage<0ul,wasm::WATParser::QuotedModule>
                ((_Variant_storage<false,std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>,wasm::Err>
                  *)__return_storage_ptr__,local_70);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_90,"expected end of module",
                 (allocator<char> *)
                 &s.
                  super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                  ._M_payload.
                  super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                  .
                  super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ._M_engaged);
      Lexer::err((Err *)local_70,in,&local_90);
      std::__detail::__variant::
      _Variant_storage<false,std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>,wasm::Err>
      ::_Variant_storage<1ul,wasm::Err>
                ((_Variant_storage<false,std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>,wasm::Err>
                  *)__return_storage_ptr__,local_70);
      std::__cxx11::string::~string((string *)local_70);
      psVar6 = &local_90;
    }
    std::__cxx11::string::~string((string *)psVar6);
    std::__cxx11::stringstream::~stringstream
              ((stringstream *)
               &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reset.buffer._M_str,"expected module",(allocator<char> *)local_70);
    Lexer::err((Err *)&id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                       super__Optional_payload_base<wasm::Name>._M_engaged,in,
               (string *)&reset.buffer._M_str);
    std::__detail::__variant::
    _Variant_storage<false,std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>,wasm::Err>
    ::_Variant_storage<1ul,wasm::Err>
              ((_Variant_storage<false,std::variant<wasm::WATParser::QuotedModule,std::shared_ptr<wasm::Module>>,wasm::Err>
                *)__return_storage_ptr__,
               &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    std::__cxx11::string::~string
              ((string *)
               &id.super__Optional_base<wasm::Name,_true,_true>._M_payload.
                super__Optional_payload_base<wasm::Name>._M_engaged);
    psVar6 = (string *)&reset.buffer._M_str;
LAB_00c855dc:
    std::__cxx11::string::~string((string *)psVar6);
  }
LAB_00c8567a:
  Lexer::~Lexer((Lexer *)local_128);
  return __return_storage_ptr__;
}

Assistant:

Result<WASTModule> wastModule(Lexer& in, bool maybeInvalid = false) {
  Lexer reset = in;
  if (!in.takeSExprStart("module"sv)) {
    return in.err("expected module");
  }
  // TODO: use ID?
  [[maybe_unused]] auto id = in.takeID();
  QuotedModuleType type;
  if (in.takeKeyword("quote"sv)) {
    type = QuotedModuleType::Text;
  } else if (in.takeKeyword("binary")) {
    type = QuotedModuleType::Binary;
  } else if (maybeInvalid) {
    // This is not a quoted text or binary module, so it must be a normal inline
    // module, but we might not be able to parse it. Treat it as through it were
    // a quoted module instead.
    int count = 1;
    while (count && in.takeUntilParen()) {
      if (in.takeLParen()) {
        ++count;
      } else if (in.takeRParen()) {
        --count;
      } else {
        return in.err("unexpected end of script");
      }
    }
    std::string mod(reset.next().substr(0, in.getPos() - reset.getPos()));
    return QuotedModule{QuotedModuleType::Text, mod};
  } else {
    // This is a normal inline module that should be parseable. Reset to the
    // start and parse it normally.
    in = std::move(reset);
    auto wasm = std::make_shared<Module>();
    CHECK_ERR(parseModule(*wasm, in));
    return wasm;
  }

  // We have a quote or binary module. Collect its contents.
  std::stringstream ss;
  while (auto s = in.takeString()) {
    ss << *s;
  }

  if (!in.takeRParen()) {
    return in.err("expected end of module");
  }

  return QuotedModule{type, ss.str()};
}